

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 uVar4;
  long lVar5;
  code *pcVar6;
  double sum_1;
  int i_1;
  double nums_1 [10];
  code *local_2160;
  sum_ptr dele_sum_1;
  double sum;
  int i;
  double nums [10];
  sum_ptr dele_sum;
  double res;
  plus_ptr dele_plus;
  char *msg;
  bootstrap_ptr dele_bootstrap;
  coreclr_create_delegate_ptr coreclr_create_dele;
  int ret;
  uint domain_id;
  void *coreclr_handle;
  char *property_values [2];
  char *property_keys [2];
  string tpa_list;
  coreclr_initialize_ptr coreclr_init;
  void *coreclr;
  allocator<char> local_2049;
  string local_2048 [8];
  string coreclr_path;
  char pkg_path [4096];
  char *last_slash;
  char app_path [4096];
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  app_path._4088_8_ = argv;
  if (argc == 2) {
    pcVar3 = realpath(*argv,(char *)&last_slash);
    if (pcVar3 == (char *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"bad path ");
      poVar2 = std::operator<<(poVar2,*(char **)app_path._4088_8_);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
    }
    else {
      pcVar3 = strrchr((char *)&last_slash,0x2f);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"app_path:");
      poVar2 = std::operator<<(poVar2,(char *)&last_slash);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"Loading CoreCLR...");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      pcVar3 = realpath(*(char **)(app_path._4088_8_ + 8),coreclr_path.field_2._M_local_buf + 8);
      if (pcVar3 == (char *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"bad path ");
        poVar2 = std::operator<<(poVar2,*(char **)(app_path._4088_8_ + 8));
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = -1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_2048,coreclr_path.field_2._M_local_buf + 8,&local_2049);
        std::allocator<char>::~allocator(&local_2049);
        std::__cxx11::string::append((char *)local_2048);
        std::__cxx11::string::append(local_2048);
        poVar2 = std::operator<<((ostream *)&std::cout,"coreclr_path:");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        uVar4 = std::__cxx11::string::c_str();
        lVar5 = dlopen(uVar4,2);
        if (lVar5 == 0) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"failed to open ");
          poVar2 = std::operator<<(poVar2,local_2048);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<((ostream *)&std::cerr,"error: ");
          pcVar3 = (char *)dlerror();
          poVar2 = std::operator<<(poVar2,pcVar3);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = -1;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Initializing CoreCLR...");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          pcVar6 = (code *)dlsym(lVar5,"coreclr_initialize");
          if (pcVar6 == (code *)0x0) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"couldn\'t find coreclr_initialize in ");
            poVar2 = std::operator<<(poVar2,local_2048);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = -1;
          }
          else {
            std::__cxx11::string::string((string *)(property_keys + 1));
            AddFilesFromDirectoryToTpaList
                      (coreclr_path.field_2._M_local_buf + 8,(string *)(property_keys + 1));
            property_values[1] = "APP_PATHS";
            property_keys[0] = "TRUSTED_PLATFORM_ASSEMBLIES";
            coreclr_handle = &last_slash;
            property_values[0] = (char *)std::__cxx11::string::c_str();
            coreclr_create_dele._0_4_ =
                 (*pcVar6)(&last_slash,"host",2,property_values + 1,&coreclr_handle,&ret,
                           (long)&coreclr_create_dele + 4);
            if ((int)coreclr_create_dele < 0) {
              poVar2 = std::operator<<((ostream *)&std::cerr,"failed to initialize coreclr. cerr = "
                                      );
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)coreclr_create_dele);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = -1;
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,"Creating delegate...");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              dele_bootstrap = (bootstrap_ptr)dlsym(lVar5,"coreclr_create_delegate");
              if (dele_bootstrap == (bootstrap_ptr)0x0) {
                poVar2 = std::operator<<((ostream *)&std::cerr,
                                         "couldn\'t find coreclr_create_delegate in ");
                poVar2 = std::operator<<(poVar2,local_2048);
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = -1;
              }
              else {
                pcVar3 = (*dele_bootstrap)(_ret,(ulong)coreclr_create_dele._4_4_,"manlib","ManLib",
                                           "Bootstrap",&msg);
                coreclr_create_dele._0_4_ = (int)pcVar3;
                if ((int)coreclr_create_dele < 0) {
                  poVar2 = std::operator<<((ostream *)&std::cerr,"couldn\'t create delegate. err = "
                                          );
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)coreclr_create_dele);
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  argv_local._4_4_ = -1;
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cout,
                                           "Calling ManLib::Bootstrap() through delegate...");
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  dele_plus = (plus_ptr)(*(code *)msg)();
                  poVar2 = std::operator<<((ostream *)&std::cout,"ManLib::Bootstrap() returned ");
                  poVar2 = std::operator<<(poVar2,(char *)dele_plus);
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  free(dele_plus);
                  pcVar3 = (*dele_bootstrap)(_ret,(ulong)coreclr_create_dele._4_4_,"manlib","ManLib"
                                             ,"Plus",&res);
                  coreclr_create_dele._0_4_ = (int)pcVar3;
                  if ((int)coreclr_create_dele < 0) {
                    poVar2 = std::operator<<((ostream *)&std::cerr,
                                             "couldn\'t create delegate. err = ");
                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)coreclr_create_dele);
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    argv_local._4_4_ = -1;
                  }
                  else {
                    poVar2 = std::operator<<((ostream *)&std::cout,
                                             "Calling ManLib::Plus() through delegate...");
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    dVar1 = (double)(*(code *)res)(0,0x4000000000000000);
                    poVar2 = std::operator<<((ostream *)&std::cout,"ManLib::Plus(1, 2) returned ");
                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar1);
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    pcVar3 = (*dele_bootstrap)(_ret,(ulong)coreclr_create_dele._4_4_,"manlib",
                                               "ManLib","Sum",nums + 9);
                    coreclr_create_dele._0_4_ = (int)pcVar3;
                    if ((int)coreclr_create_dele < 0) {
                      poVar2 = std::operator<<((ostream *)&std::cerr,
                                               "couldn\'t create delegate. err = ");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)coreclr_create_dele);
                      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                      argv_local._4_4_ = -1;
                    }
                    else {
                      for (sum._4_4_ = 0; sum._4_4_ < 10; sum._4_4_ = sum._4_4_ + 1) {
                        nums[(long)sum._4_4_ + -1] = (double)sum._4_4_;
                      }
                      poVar2 = std::operator<<((ostream *)&std::cout,
                                               "Calling ManLib::Sum() through delegate...");
                      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                      dele_sum_1 = (sum_ptr)(*(code *)nums[9])(&stack0xffffffffffffdeb8,10);
                      poVar2 = std::operator<<((ostream *)&std::cout,
                                               "ManLib::Sum(1:10, 10) returned ");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)dele_sum_1);
                      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                      pcVar3 = (*dele_bootstrap)(_ret,(ulong)coreclr_create_dele._4_4_,"manlib",
                                                 "ManLib","Sum2",&local_2160);
                      coreclr_create_dele._0_4_ = (int)pcVar3;
                      if ((int)coreclr_create_dele < 0) {
                        poVar2 = std::operator<<((ostream *)&std::cerr,
                                                 "couldn\'t create delegate. err = ");
                        poVar2 = (ostream *)
                                 std::ostream::operator<<(poVar2,(int)coreclr_create_dele);
                        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                        argv_local._4_4_ = -1;
                      }
                      else {
                        for (sum_1._4_4_ = 0; sum_1._4_4_ < 10; sum_1._4_4_ = sum_1._4_4_ + 1) {
                          nums_1[(long)sum_1._4_4_ + -1] = (double)sum_1._4_4_;
                        }
                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                 "Calling ManLib::Sum2() through delegate...");
                        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                        dVar1 = (double)(*local_2160)(&stack0xffffffffffffde48,10);
                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                 "ManLib::Sum2(1:10, 10) returned ");
                        poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar1);
                        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                        dlclose(lVar5);
                      }
                    }
                  }
                }
              }
            }
            std::__cxx11::string::~string((string *)(property_keys + 1));
          }
        }
        std::__cxx11::string::~string(local_2048);
      }
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: host <core_clr_path>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2) {
    cerr << "Usage: host <core_clr_path>" << endl;
    return -1;
  }

  char app_path[PATH_MAX];
  if (realpath(argv[0], app_path) == NULL) {
    cerr << "bad path " << argv[0] << endl;
    return -1;
  }

  char *last_slash = strrchr(app_path, '/');
  if (last_slash != NULL)
    *last_slash = 0;

  cout << "app_path:" << app_path << endl;

  cout << "Loading CoreCLR..." << endl;

  char pkg_path[PATH_MAX];
  if (realpath(argv[1], pkg_path) == NULL) {
    cerr << "bad path " << argv[1] << endl;
    return -1;
  }

  //
  // Load CoreCLR
  //
  string coreclr_path(pkg_path);
  coreclr_path.append("/");
  coreclr_path.append(libcoreclr);

  cout << "coreclr_path:" << coreclr_path.c_str() << endl;

  void *coreclr = dlopen(coreclr_path.c_str(), RTLD_NOW | RTLD_LOCAL);
  if (coreclr == NULL) {
    cerr << "failed to open " << coreclr_path << endl;
    cerr << "error: " << dlerror() << endl;
    return -1;
  }

  //
  // Initialize CoreCLR
  //
  std::cout << "Initializing CoreCLR..." << endl;

  coreclr_initialize_ptr coreclr_init =
      reinterpret_cast<coreclr_initialize_ptr>(
          dlsym(coreclr, "coreclr_initialize"));
  if (coreclr_init == NULL) {
    cerr << "couldn't find coreclr_initialize in " << coreclr_path << endl;
    return -1;
  }

  string tpa_list;
  AddFilesFromDirectoryToTpaList(pkg_path, tpa_list);

  const char *property_keys[] = {"APP_PATHS", "TRUSTED_PLATFORM_ASSEMBLIES"};
  const char *property_values[] = {// APP_PATHS
                                   app_path,
                                   // TRUSTED_PLATFORM_ASSEMBLIES
                                   tpa_list.c_str()};

  void *coreclr_handle;
  unsigned int domain_id;
  int ret =
      coreclr_init(app_path, // exePath
                   "host",   // appDomainFriendlyName
                   sizeof(property_values) / sizeof(char *), // propertyCount
                   property_keys,                            // propertyKeys
                   property_values,                          // propertyValues
                   &coreclr_handle,                          // hostHandle
                   &domain_id                                // domainId
      );
  if (ret < 0) {
    cerr << "failed to initialize coreclr. cerr = " << ret << endl;
    return -1;
  }

  //
  // Once CoreCLR is initialized, bind to the delegate
  //
  std::cout << "Creating delegate..." << endl;
  coreclr_create_delegate_ptr coreclr_create_dele =
      reinterpret_cast<coreclr_create_delegate_ptr>(
          dlsym(coreclr, "coreclr_create_delegate"));
  if (coreclr_create_dele == NULL) {
    cerr << "couldn't find coreclr_create_delegate in " << coreclr_path << endl;
    return -1;
  }

  {
    // Create the delegate to ManLib::Bootstrap()
    bootstrap_ptr dele_bootstrap;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Bootstrap",
                              reinterpret_cast<void **>(&dele_bootstrap));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Bootstrap()
    cout << "Calling ManLib::Bootstrap() through delegate..." << endl;

    char *msg = dele_bootstrap();
    cout << "ManLib::Bootstrap() returned " << msg << endl;
    free(msg); // returned string need to be free-ed
  }

  {
    // Create the delegate to ManLib::Plus()
    plus_ptr dele_plus;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Plus", reinterpret_cast<void **>(&dele_plus));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Plus()
    cout << "Calling ManLib::Plus() through delegate..." << endl;

    double res = dele_plus(1, 2);
    cout << "ManLib::Plus(1, 2) returned " << res << endl;
  }

  {
    // Create the delegate to ManLib::Sum(double*, int)
    sum_ptr dele_sum;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Sum", reinterpret_cast<void **>(&dele_sum));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Sum()
    double nums[10];
    for (int i = 0; i < 10; i++) {
      nums[i] = i;
    }
    cout << "Calling ManLib::Sum() through delegate..." << endl;
    double sum = dele_sum(nums, 10);
    cout << "ManLib::Sum(1:10, 10) returned " << sum << endl;
  }

  {
    // Create the delegate to ManLib::Sum2(double*, int)
    sum_ptr dele_sum;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Sum2", reinterpret_cast<void **>(&dele_sum));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Sum()
    double nums[10];
    for (int i = 0; i < 10; i++) {
      nums[i] = i;
    }
    cout << "Calling ManLib::Sum2() through delegate..." << endl;
    double sum = dele_sum(nums, 10);
    cout << "ManLib::Sum2(1:10, 10) returned " << sum << endl;
  }

  dlclose(coreclr);
}